

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue245(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint32_t min;
  char *__s;
  
  r = roaring_bitmap_create();
  roaring_bitmap_add_range_closed(r,0,8);
  for (min = 10; min != 0x1008; min = min + 2) {
    roaring_bitmap_add_range_closed(r,min,min);
  }
  _Var1 = check_serialization(r);
  if (_Var1) {
    roaring_bitmap_add_range_closed(r,0x100a,0x100a);
    _Var1 = check_serialization(r);
    if (_Var1) {
      roaring_bitmap_free(r);
      return;
    }
    __s = "Bitmaps do not match at 2049 entries";
  }
  else {
    __s = "Bitmaps do not match at 2048 entries";
  }
  puts(__s);
  abort();
}

Assistant:

DEFINE_TEST(issue245) {
    roaring_bitmap_t *bitmap = roaring_bitmap_create();
    const uint32_t targetEntries = 2048;
    const int32_t runLength = 8;
    int32_t offset = 0;
    // Add a single run more than 2 extents longs.
    roaring_bitmap_add_range_closed(bitmap, offset, offset + runLength);
    offset += runLength + 2;
    // Add 2047 non-contiguous bits.
    for (uint32_t count = 1; count < targetEntries; count++, offset += 2) {
        roaring_bitmap_add_range_closed(bitmap, offset, offset);
    }

    if (!check_serialization(bitmap)) {
        printf("Bitmaps do not match at 2048 entries\n");
        abort();
    }

    // Add one more, forcing it to become a bitset
    offset += 2;
    roaring_bitmap_add_range_closed(bitmap, offset, offset);

    if (!check_serialization(bitmap)) {
        printf("Bitmaps do not match at 2049 entries\n");
        abort();
    }
    roaring_bitmap_free(bitmap);
}